

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::RuleBasedCollator::compareUTF8
          (RuleBasedCollator *this,StringPiece *left,StringPiece *right,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t leftLength;
  int32_t rightLength;
  uint8_t *left_00;
  uint8_t *right_00;
  uint8_t *rightBytes;
  uint8_t *leftBytes;
  UErrorCode *errorCode_local;
  StringPiece *right_local;
  StringPiece *left_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    left_00 = (uint8_t *)StringPiece::data(left);
    right_00 = (uint8_t *)StringPiece::data(right);
    if (((left_00 == (uint8_t *)0x0) && (UVar1 = StringPiece::empty(left), UVar1 == '\0')) ||
       ((right_00 == (uint8_t *)0x0 && (UVar1 = StringPiece::empty(right), UVar1 == '\0')))) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = UCOL_EQUAL;
    }
    else {
      leftLength = StringPiece::length(left);
      rightLength = StringPiece::length(right);
      this_local._4_4_ = doCompare(this,left_00,leftLength,right_00,rightLength,errorCode);
    }
    return this_local._4_4_;
  }
  return UCOL_EQUAL;
}

Assistant:

UCollationResult
RuleBasedCollator::compareUTF8(const StringPiece &left, const StringPiece &right,
                               UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_EQUAL; }
    const uint8_t *leftBytes = reinterpret_cast<const uint8_t *>(left.data());
    const uint8_t *rightBytes = reinterpret_cast<const uint8_t *>(right.data());
    if((leftBytes == NULL && !left.empty()) || (rightBytes == NULL && !right.empty())) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    return doCompare(leftBytes, left.length(), rightBytes, right.length(), errorCode);
}